

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

uchar * gen_publickey_from_dsa(LIBSSH2_SESSION *session,EVP_PKEY *dsa,size_t *key_len)

{
  int iVar1;
  uchar *puVar2;
  BIGNUM *local_70;
  BIGNUM *pub_key;
  BIGNUM *g;
  BIGNUM *q;
  BIGNUM *p_bn;
  uchar *p;
  uchar *key;
  unsigned_long len;
  int k_bytes;
  int g_bytes;
  int q_bytes;
  int p_bytes;
  size_t *key_len_local;
  EVP_PKEY *dsa_local;
  LIBSSH2_SESSION *session_local;
  
  _q_bytes = key_len;
  key_len_local = (size_t *)dsa;
  dsa_local = (EVP_PKEY *)session;
  EVP_PKEY_get_bn_param(dsa,"p",&q);
  EVP_PKEY_get_bn_param(key_len_local,"g",&g);
  EVP_PKEY_get_bn_param(key_len_local,"q",&pub_key);
  EVP_PKEY_get_bn_param(key_len_local,"pub",&local_70);
  iVar1 = BN_num_bits((BIGNUM *)q);
  g_bytes = (iVar1 + 7) / 8 + 1;
  iVar1 = BN_num_bits((BIGNUM *)g);
  k_bytes = (iVar1 + 7) / 8 + 1;
  iVar1 = BN_num_bits((BIGNUM *)pub_key);
  len._4_4_ = (iVar1 + 7) / 8 + 1;
  iVar1 = BN_num_bits(local_70);
  len._0_4_ = (iVar1 + 7) / 8 + 1;
  key = (uchar *)(long)(g_bytes + k_bytes + len._4_4_ + 0x1b + (int)len);
  p_bn = (BIGNUM *)(**(code **)(dsa_local + 8))(key,dsa_local,(long)(iVar1 + 7) % 8 & 0xffffffff);
  if (p_bn == (BIGNUM *)0x0) {
    session_local = (LIBSSH2_SESSION *)0x0;
  }
  else {
    p = (uchar *)p_bn;
    _libssh2_htonu32((uchar *)p_bn,7);
    *(undefined4 *)(p_bn + 4) = 0x2d687373;
    *(undefined2 *)(p_bn + 8) = 0x7364;
    p_bn[10] = (BIGNUM)0x73;
    p_bn = p_bn + 0xb;
    p_bn = (BIGNUM *)write_bn((uchar *)p_bn,q,g_bytes);
    p_bn = (BIGNUM *)write_bn((uchar *)p_bn,g,k_bytes);
    p_bn = (BIGNUM *)write_bn((uchar *)p_bn,pub_key,len._4_4_);
    puVar2 = write_bn((uchar *)p_bn,(BIGNUM *)local_70,(int)len);
    *_q_bytes = (long)puVar2 - (long)p;
    session_local = (LIBSSH2_SESSION *)p;
  }
  return (uchar *)session_local;
}

Assistant:

static unsigned char *
gen_publickey_from_dsa(LIBSSH2_SESSION* session, libssh2_dsa_ctx *dsa,
                       size_t *key_len)
{
    int            p_bytes, q_bytes, g_bytes, k_bytes;
    unsigned long  len;
    unsigned char *key;
    unsigned char *p;

#ifdef USE_OPENSSL_3
    BIGNUM * p_bn;
    BIGNUM * q;
    BIGNUM * g;
    BIGNUM * pub_key;

    EVP_PKEY_get_bn_param(dsa, OSSL_PKEY_PARAM_FFC_P, &p_bn);
    EVP_PKEY_get_bn_param(dsa, OSSL_PKEY_PARAM_FFC_G, &q);
    EVP_PKEY_get_bn_param(dsa, OSSL_PKEY_PARAM_FFC_Q, &g);
    EVP_PKEY_get_bn_param(dsa, OSSL_PKEY_PARAM_PUB_KEY, &pub_key);
#else
    const BIGNUM * p_bn;
    const BIGNUM * q;
    const BIGNUM * g;
    const BIGNUM * pub_key;
#ifdef HAVE_OPAQUE_STRUCTS
    DSA_get0_pqg(dsa, &p_bn, &q, &g);
#else
    p_bn = dsa->p;
    q = dsa->q;
    g = dsa->g;
#endif

#ifdef HAVE_OPAQUE_STRUCTS
    DSA_get0_key(dsa, &pub_key, NULL);
#else
    pub_key = dsa->pub_key;
#endif
#endif
    p_bytes = BN_num_bytes(p_bn) + 1;
    q_bytes = BN_num_bytes(q) + 1;
    g_bytes = BN_num_bytes(g) + 1;
    k_bytes = BN_num_bytes(pub_key) + 1;

    /* Key form is "ssh-dss" + p + q + g + pub_key. */
    len = 4 + 7 + 4 + p_bytes + 4 + q_bytes + 4 + g_bytes + 4 + k_bytes;

    key = LIBSSH2_ALLOC(session, len);
    if(!key) {
        return NULL;
    }

    /* Process key encoding. */
    p = key;

    _libssh2_htonu32(p, 7);  /* Key type. */
    p += 4;
    memcpy(p, "ssh-dss", 7);
    p += 7;

    p = write_bn(p, p_bn, p_bytes);
    p = write_bn(p, q, q_bytes);
    p = write_bn(p, g, g_bytes);
    p = write_bn(p, pub_key, k_bytes);

    *key_len = (size_t)(p - key);
    return key;
}